

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

ALLEGRO_DISPLAY * al_get_current_display(void)

{
  long *plVar1;
  ALLEGRO_DISPLAY *pAVar2;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar1 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
  }
  if (*plVar1 == 0) {
    pAVar2 = (ALLEGRO_DISPLAY *)0x0;
  }
  else {
    pAVar2 = *(ALLEGRO_DISPLAY **)(*plVar1 + 0xd0);
  }
  return pAVar2;
}

Assistant:

ALLEGRO_DISPLAY *al_get_current_display(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return NULL;
   return tls->current_display;
}